

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS
ref_split_edge_tri_conformity
          (REF_BOOL verbose,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,
          REF_BOOL *allowed)

{
  REF_GEOM ref_geom_00;
  REF_NODE ref_node_00;
  uint uVar1;
  REF_INT local_144;
  REF_INT local_140;
  int local_13c;
  REF_INT local_138;
  REF_INT local_134;
  int local_130;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL normdev1;
  REF_DBL normdev0;
  REF_DBL normdev;
  REF_DBL uv_area;
  REF_DBL uv_area1;
  REF_DBL uv_area0;
  REF_DBL sign_uv_area;
  int local_c0;
  REF_INT node;
  REF_INT cell_node;
  REF_INT item;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_BOOL *allowed_local;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  REF_BOOL verbose_local;
  
  ref_geom_00 = ref_grid->geom;
  ref_node_00 = ref_grid->node;
  *allowed = 0;
  if (0 < ref_geom_00->n) {
    unique0x00012000 = ref_grid->cell[3];
    if ((node0 < 0) || (unique0x00012000->ref_adj->nnode <= node0)) {
      local_130 = -1;
    }
    else {
      local_130 = unique0x00012000->ref_adj->first[node0];
    }
    node = local_130;
    if (local_130 == -1) {
      local_134 = -1;
    }
    else {
      local_134 = unique0x00012000->ref_adj->item[local_130].ref;
    }
    nodes[0x19] = local_134;
    while (node != -1) {
      for (local_c0 = 0; local_c0 < stack0xffffffffffffffb8->node_per; local_c0 = local_c0 + 1) {
        if (node1 == stack0xffffffffffffffb8->c2n
                     [local_c0 + stack0xffffffffffffffb8->size_per * nodes[0x19]]) {
          uVar1 = ref_cell_nodes(stack0xffffffffffffffb8,nodes[0x19],&cell_node);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x301,"ref_split_edge_tri_conformity",(ulong)uVar1,"cell nodes");
            return uVar1;
          }
          uVar1 = ref_geom_tri_norm_deviation(ref_grid,&cell_node,&normdev0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x302,"ref_split_edge_tri_conformity",(ulong)uVar1,"nd");
            return uVar1;
          }
          for (sign_uv_area._4_4_ = 0; sign_uv_area._4_4_ < stack0xffffffffffffffb8->node_per;
              sign_uv_area._4_4_ = sign_uv_area._4_4_ + 1) {
            if (node0 == (&cell_node)[sign_uv_area._4_4_]) {
              (&cell_node)[sign_uv_area._4_4_] = new_node;
            }
          }
          uVar1 = ref_geom_tri_norm_deviation(ref_grid,&cell_node,&normdev1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x306,"ref_split_edge_tri_conformity",(ulong)uVar1,"nd0");
            return uVar1;
          }
          for (sign_uv_area._4_4_ = 0; sign_uv_area._4_4_ < stack0xffffffffffffffb8->node_per;
              sign_uv_area._4_4_ = sign_uv_area._4_4_ + 1) {
            if (new_node == (&cell_node)[sign_uv_area._4_4_]) {
              (&cell_node)[sign_uv_area._4_4_] = node0;
            }
          }
          for (sign_uv_area._4_4_ = 0; sign_uv_area._4_4_ < stack0xffffffffffffffb8->node_per;
              sign_uv_area._4_4_ = sign_uv_area._4_4_ + 1) {
            if (node1 == (&cell_node)[sign_uv_area._4_4_]) {
              (&cell_node)[sign_uv_area._4_4_] = new_node;
            }
          }
          uVar1 = ref_geom_tri_norm_deviation
                            (ref_grid,&cell_node,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x30d,"ref_split_edge_tri_conformity",(ulong)uVar1,"nd1");
            return uVar1;
          }
          if (((normdev1 <= normdev0) && (normdev1 < ref_grid->adapt->post_min_normdev)) ||
             ((_ref_private_macro_code_rss_1 <= normdev0 &&
              (_ref_private_macro_code_rss_1 < ref_grid->adapt->post_min_normdev)))) {
            if (verbose != 0) {
              printf("nd %f %f %f\n",normdev0,normdev1,_ref_private_macro_code_rss_1);
            }
            *allowed = 0;
            return 0;
          }
        }
      }
      node = stack0xffffffffffffffb8->ref_adj->item[node].next;
      if (node == -1) {
        local_138 = -1;
      }
      else {
        local_138 = stack0xffffffffffffffb8->ref_adj->item[node].ref;
      }
      nodes[0x19] = local_138;
    }
  }
  if ((0 < ref_geom_00->n) && (ref_geom_00->meshlink == (void *)0x0)) {
    unique0x00012000 = ref_grid->cell[3];
    if ((node0 < 0) || (unique0x00012000->ref_adj->nnode <= node0)) {
      local_13c = -1;
    }
    else {
      local_13c = unique0x00012000->ref_adj->first[node0];
    }
    node = local_13c;
    if (local_13c == -1) {
      local_140 = -1;
    }
    else {
      local_140 = unique0x00012000->ref_adj->item[local_13c].ref;
    }
    nodes[0x19] = local_140;
    while (node != -1) {
      for (local_c0 = 0; local_c0 < stack0xffffffffffffffb8->node_per; local_c0 = local_c0 + 1) {
        if (node1 == stack0xffffffffffffffb8->c2n
                     [local_c0 + stack0xffffffffffffffb8->size_per * nodes[0x19]]) {
          uVar1 = ref_cell_nodes(stack0xffffffffffffffb8,nodes[0x19],&cell_node);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x31d,"ref_split_edge_tri_conformity",(ulong)uVar1,"cell nodes");
            return uVar1;
          }
          uVar1 = ref_geom_uv_area(ref_geom_00,&cell_node,&normdev);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x31e,"ref_split_edge_tri_conformity",(ulong)uVar1,"uv area");
            return uVar1;
          }
          uVar1 = ref_geom_uv_area_sign(ref_grid,nodes[1],&uv_area0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,799,"ref_split_edge_tri_conformity",(ulong)uVar1,"sign");
            return uVar1;
          }
          normdev = uv_area0 * normdev;
          for (sign_uv_area._4_4_ = 0; sign_uv_area._4_4_ < stack0xffffffffffffffb8->node_per;
              sign_uv_area._4_4_ = sign_uv_area._4_4_ + 1) {
            if (node0 == (&cell_node)[sign_uv_area._4_4_]) {
              (&cell_node)[sign_uv_area._4_4_] = new_node;
            }
          }
          uVar1 = ref_geom_uv_area(ref_geom_00,&cell_node,&uv_area1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x324,"ref_split_edge_tri_conformity",(ulong)uVar1,"uv area");
            return uVar1;
          }
          uVar1 = ref_geom_uv_area_sign(ref_grid,nodes[1],&uv_area0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x325,"ref_split_edge_tri_conformity",(ulong)uVar1,"sign");
            return uVar1;
          }
          uv_area1 = uv_area0 * uv_area1;
          for (sign_uv_area._4_4_ = 0; sign_uv_area._4_4_ < stack0xffffffffffffffb8->node_per;
              sign_uv_area._4_4_ = sign_uv_area._4_4_ + 1) {
            if (new_node == (&cell_node)[sign_uv_area._4_4_]) {
              (&cell_node)[sign_uv_area._4_4_] = node0;
            }
          }
          for (sign_uv_area._4_4_ = 0; sign_uv_area._4_4_ < stack0xffffffffffffffb8->node_per;
              sign_uv_area._4_4_ = sign_uv_area._4_4_ + 1) {
            if (node1 == (&cell_node)[sign_uv_area._4_4_]) {
              (&cell_node)[sign_uv_area._4_4_] = new_node;
            }
          }
          uVar1 = ref_geom_uv_area(ref_geom_00,&cell_node,&uv_area);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x32d,"ref_split_edge_tri_conformity",(ulong)uVar1,"uv area");
            return uVar1;
          }
          uVar1 = ref_geom_uv_area_sign(ref_grid,nodes[1],&uv_area0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x32e,"ref_split_edge_tri_conformity",(ulong)uVar1,"sign");
            return uVar1;
          }
          uv_area = uv_area0 * uv_area;
          if ((uv_area1 <= ref_node_00->min_uv_area) || (uv_area <= ref_node_00->min_uv_area)) {
            *allowed = 0;
            if (verbose != 0) {
              printf("area orig %e new %e %e\n",normdev,uv_area1,uv_area);
              ref_node_location(ref_node_00,node0);
              ref_node_location(ref_node_00,node1);
            }
            return 0;
          }
        }
      }
      node = stack0xffffffffffffffb8->ref_adj->item[node].next;
      if (node == -1) {
        local_144 = -1;
      }
      else {
        local_144 = stack0xffffffffffffffb8->ref_adj->item[node].ref;
      }
      nodes[0x19] = local_144;
    }
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tri_conformity(REF_BOOL verbose,
                                                 REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_INT new_node,
                                                 REF_BOOL *allowed) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL sign_uv_area, uv_area0, uv_area1, uv_area;
  REF_DBL normdev, normdev0, normdev1;

  *allowed = REF_FALSE;

  if (0 < ref_geom_n(ref_geom)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "nd");

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev0), "nd0");

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (new_node == nodes[node]) nodes[node] = node0;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node1 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev1), "nd1");

      if ((normdev0 <= normdev &&
           normdev0 < ref_grid_adapt(ref_grid, post_min_normdev)) ||
          (normdev1 <= normdev &&
           normdev1 < ref_grid_adapt(ref_grid, post_min_normdev))) {
        if (verbose) printf("nd %f %f %f\n", normdev, normdev0, normdev1);
        *allowed = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  if (0 < ref_geom_n(ref_geom) && !ref_geom_meshlinked(ref_geom)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area0), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area0 *= sign_uv_area;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (new_node == nodes[node]) nodes[node] = node0;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node1 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area1), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area1 *= sign_uv_area;

      if (ref_node_min_uv_area(ref_node) >= uv_area0 ||
          ref_node_min_uv_area(ref_node) >= uv_area1) {
        *allowed = REF_FALSE;
        if (verbose) {
          printf("area orig %e new %e %e\n", uv_area, uv_area0, uv_area1);
          ref_node_location(ref_node, node0);
          ref_node_location(ref_node, node1);
        }
        return REF_SUCCESS;
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}